

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O2

Request<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
* __thiscall
capnproto_test::capnp::test::TestMembrane::Client::callPassThroughRequest
          (Request<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  Maybe<capnp::MessageSize> local_20;
  
  local_20.ptr.isSet = (sizeHint->ptr).isSet;
  if (local_20.ptr.isSet == true) {
    local_20.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
    local_20.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>
            (__return_storage_ptr__,
             (Client *)((long)&this->_vptr_Client + (long)this->_vptr_Client[-3]),0xc07d8dcd80a69c0c
             ,1,&local_20);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,  ::capnproto_test::capnp::test::TestMembrane::Result>
TestMembrane::Client::callPassThroughRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(
      0xc07d8dcd80a69c0cull, 1, sizeHint);
}